

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall
RegisterParserTestMultipleOutputs::RegisterParserTestMultipleOutputs
          (RegisterParserTestMultipleOutputs *this)

{
  RegisterParserTestMultipleOutputs *this_local;
  
  RegisterTest(ParserTestMultipleOutputs::Create,"ParserTest.MultipleOutputs");
  return;
}

Assistant:

TEST_F(ParserTest, MultipleOutputs) {
  State local_state;
  ManifestParser parser(&local_state, NULL);
  string err;
  EXPECT_TRUE(parser.ParseTest("rule cc\n  command = foo\n  depfile = bar\n"
                               "build a.o b.o: cc c.cc\n",
                               &err));
  EXPECT_EQ("", err);
}